

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalDiscardTexture(ShaderEvalContext *c)

{
  Vector<float,_3> local_50;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  float local_30;
  int local_28;
  int iStack_24;
  float local_20;
  
  local_50.m_data[2] = (c->coords).m_data[2];
  local_50.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  _local_30 = &c->color;
  local_28 = 0;
  iStack_24 = 1;
  local_20 = 2.8026e-45;
  tcu::VecAccess<float,_4,_3>::operator=
            ((VecAccess<float,_4,_3> *)&stack0xffffffffffffffd0,&local_50);
  local_40.m_data = *(float (*) [2])(c->coords).m_data;
  tcu::operator*(0.25,&local_40);
  tcu::operator+(0.5,&local_38);
  deqp::gls::ShaderEvalContext::texture2D
            ((ShaderEvalContext *)&stack0xffffffffffffffd0,(int)c,(Vec2 *)0x0);
  if (local_30 < 0.7) {
    c->isDiscarded = true;
  }
  return;
}

Assistant:

inline void evalDiscardTexture (ShaderEvalContext& c)
{
	c.color.xyz() = c.coords.swizzle(0,1,2);
	if (c.texture2D(0, c.coords.swizzle(0,1) * 0.25f + 0.5f).x() < 0.7f)
		c.discard();
}